

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O0

int __thiscall ncnn::Padding::load_model(Padding *this,ModelBin *mb)

{
  long *in_RSI;
  Mat *in_RDI;
  Mat *m;
  Mat local_50;
  
  if ((int)in_RDI[3].elemsize != 0) {
    m = &local_50;
    (**(code **)(*in_RSI + 0x10))(m,in_RSI,(int)in_RDI[3].elemsize,1);
    Mat::operator=(in_RDI,m);
    Mat::~Mat((Mat *)0x1a8d8b);
  }
  return 0;
}

Assistant:

int Padding::load_model(const ModelBin& mb)
{
    if (per_channel_pad_data_size)
    {
        per_channel_pad_data = mb.load(per_channel_pad_data_size, 1);
    }

    return 0;
}